

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlParserErrors
xmlParseExternalEntityPrivate
          (xmlDocPtr doc,xmlParserCtxtPtr oldctxt,xmlSAXHandlerPtr sax,void *user_data,int depth,
          xmlChar *URL,xmlChar *ID,xmlNodePtr *list)

{
  xmlCharEncoding enc_00;
  int iVar1;
  xmlParserCtxtPtr ctxt_00;
  xmlDocPtr doc_00;
  xmlChar *pxVar2;
  _xmlNode *local_70;
  xmlNodePtr cur;
  xmlChar local_60;
  xmlChar local_5f;
  xmlChar local_5e;
  xmlChar local_5d;
  xmlCharEncoding enc;
  xmlChar start [4];
  xmlParserErrors ret;
  xmlNodePtr newRoot;
  xmlDocPtr newDoc;
  xmlParserCtxtPtr ctxt;
  xmlChar *URL_local;
  int depth_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  xmlParserCtxtPtr oldctxt_local;
  xmlDocPtr doc_local;
  
  enc = XML_CHAR_ENCODING_NONE;
  if (((depth < 0x29) ||
      ((oldctxt != (xmlParserCtxtPtr)0x0 && ((oldctxt->options & 0x80000U) != 0)))) &&
     (depth < 0x401)) {
    if (list != (xmlNodePtr *)0x0) {
      *list = (xmlNodePtr)0x0;
    }
    if ((URL == (xmlChar *)0x0) && (ID == (xmlChar *)0x0)) {
      doc_local._4_4_ = XML_ERR_INTERNAL_ERROR;
    }
    else if (doc == (xmlDocPtr)0x0) {
      doc_local._4_4_ = XML_ERR_INTERNAL_ERROR;
    }
    else {
      ctxt_00 = xmlCreateEntityParserCtxtInternal(sax,user_data,URL,ID,(xmlChar *)0x0,oldctxt);
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        doc_local._4_4_ = XML_WAR_UNDECLARED_ENTITY;
      }
      else {
        xmlDetectSAX2(ctxt_00);
        doc_00 = xmlNewDoc("1.0");
        if (doc_00 == (xmlDocPtr)0x0) {
          xmlFreeParserCtxt(ctxt_00);
          doc_local._4_4_ = XML_ERR_INTERNAL_ERROR;
        }
        else {
          doc_00->properties = 0x40;
          if (doc != (xmlDocPtr)0x0) {
            doc_00->intSubset = doc->intSubset;
            doc_00->extSubset = doc->extSubset;
            if (doc->dict != (_xmlDict *)0x0) {
              doc_00->dict = doc->dict;
              xmlDictReference(doc_00->dict);
            }
            if (doc->URL != (xmlChar *)0x0) {
              pxVar2 = xmlStrdup(doc->URL);
              doc_00->URL = pxVar2;
            }
          }
          _start = xmlNewDocNode(doc_00,(xmlNsPtr)0x0,(xmlChar *)"pseudoroot",(xmlChar *)0x0);
          if (_start == (xmlNodePtr)0x0) {
            if (sax != (xmlSAXHandlerPtr)0x0) {
              xmlFreeParserCtxt(ctxt_00);
            }
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
            xmlFreeDoc(doc_00);
            doc_local._4_4_ = XML_ERR_INTERNAL_ERROR;
          }
          else {
            xmlAddChild((xmlNodePtr)doc_00,_start);
            nodePush(ctxt_00,doc_00->children);
            if (doc == (xmlDocPtr)0x0) {
              ctxt_00->myDoc = doc_00;
            }
            else {
              ctxt_00->myDoc = doc;
              _start->doc = doc;
            }
            if ((ctxt_00->progressive == 0) &&
               ((long)ctxt_00->input->end - (long)ctxt_00->input->cur < 0xfa)) {
              xmlGROW(ctxt_00);
            }
            if (3 < (long)ctxt_00->input->end - (long)ctxt_00->input->cur) {
              local_60 = *ctxt_00->input->cur;
              local_5f = ctxt_00->input->cur[1];
              local_5e = ctxt_00->input->cur[2];
              local_5d = ctxt_00->input->cur[3];
              enc_00 = xmlDetectCharEncoding(&local_60,4);
              if (enc_00 != XML_CHAR_ENCODING_NONE) {
                xmlSwitchEncoding(ctxt_00,enc_00);
              }
            }
            if (((((*ctxt_00->input->cur == '<') && (ctxt_00->input->cur[1] == '?')) &&
                 (ctxt_00->input->cur[2] == 'x')) &&
                ((ctxt_00->input->cur[3] == 'm' && (ctxt_00->input->cur[4] == 'l')))) &&
               (((ctxt_00->input->cur[5] == ' ' ||
                 ((8 < ctxt_00->input->cur[5] && (ctxt_00->input->cur[5] < 0xb)))) ||
                (ctxt_00->input->cur[5] == '\r')))) {
              xmlParseTextDecl(ctxt_00);
              iVar1 = xmlStrEqual(oldctxt->version,"1.0");
              if ((iVar1 != 0) && (iVar1 = xmlStrEqual(ctxt_00->input->version,"1.0"), iVar1 == 0))
              {
                xmlFatalErrMsg(ctxt_00,XML_ERR_VERSION_MISMATCH,
                               "Version mismatch between document and entity\n");
              }
            }
            ctxt_00->instate = XML_PARSER_CONTENT;
            ctxt_00->depth = depth;
            if (oldctxt == (xmlParserCtxtPtr)0x0) {
              ctxt_00->_private = (void *)0x0;
              ctxt_00->validate = 0;
              ctxt_00->external = 2;
              ctxt_00->loadsubset = 0;
            }
            else {
              ctxt_00->_private = oldctxt->_private;
              ctxt_00->loadsubset = oldctxt->loadsubset;
              ctxt_00->validate = oldctxt->validate;
              ctxt_00->valid = oldctxt->valid;
              ctxt_00->replaceEntities = oldctxt->replaceEntities;
              if (oldctxt->validate != 0) {
                (ctxt_00->vctxt).error = (oldctxt->vctxt).error;
                (ctxt_00->vctxt).warning = (oldctxt->vctxt).warning;
                (ctxt_00->vctxt).userData = (oldctxt->vctxt).userData;
              }
              ctxt_00->external = oldctxt->external;
              if (ctxt_00->dict != (xmlDictPtr)0x0) {
                xmlDictFree(ctxt_00->dict);
              }
              ctxt_00->dict = oldctxt->dict;
              pxVar2 = xmlDictLookup(ctxt_00->dict,"xml",3);
              ctxt_00->str_xml = pxVar2;
              pxVar2 = xmlDictLookup(ctxt_00->dict,"xmlns",5);
              ctxt_00->str_xmlns = pxVar2;
              pxVar2 = xmlDictLookup(ctxt_00->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace"
                                     ,0x24);
              ctxt_00->str_xml_ns = pxVar2;
              ctxt_00->dictNames = oldctxt->dictNames;
              ctxt_00->attsDefault = oldctxt->attsDefault;
              ctxt_00->attsSpecial = oldctxt->attsSpecial;
              ctxt_00->linenumbers = oldctxt->linenumbers;
              ctxt_00->record_info = oldctxt->record_info;
              (ctxt_00->node_seq).maximum = (oldctxt->node_seq).maximum;
              (ctxt_00->node_seq).length = (oldctxt->node_seq).length;
              (ctxt_00->node_seq).buffer = (oldctxt->node_seq).buffer;
            }
            xmlParseContent(ctxt_00);
            if ((*ctxt_00->input->cur == '<') && (ctxt_00->input->cur[1] == '/')) {
              xmlFatalErr(ctxt_00,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
            }
            else if (*ctxt_00->input->cur != '\0') {
              xmlFatalErr(ctxt_00,XML_ERR_EXTRA_CONTENT,(char *)0x0);
            }
            if (ctxt_00->node != doc_00->children) {
              xmlFatalErr(ctxt_00,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
            }
            if (ctxt_00->wellFormed == 0) {
              if (ctxt_00->errNo == 0) {
                enc = XML_CHAR_ENCODING_UTF8;
              }
              else {
                enc = ctxt_00->errNo;
              }
            }
            else {
              if (list != (xmlNodePtr *)0x0) {
                local_70 = doc_00->children->children;
                *list = local_70;
                for (; local_70 != (_xmlNode *)0x0; local_70 = local_70->next) {
                  local_70->parent = (_xmlNode *)0x0;
                }
                doc_00->children->children = (_xmlNode *)0x0;
              }
              enc = XML_CHAR_ENCODING_NONE;
            }
            if (oldctxt != (xmlParserCtxtPtr)0x0) {
              oldctxt->nbentities = ctxt_00->nbentities + oldctxt->nbentities;
            }
            if ((ctxt_00->input != (xmlParserInputPtr)0x0) && (oldctxt != (xmlParserCtxtPtr)0x0)) {
              oldctxt->sizeentities = ctxt_00->input->consumed + oldctxt->sizeentities;
              oldctxt->sizeentities =
                   (unsigned_long)
                   (ctxt_00->input->cur + (oldctxt->sizeentities - (long)ctxt_00->input->base));
            }
            if ((oldctxt != (xmlParserCtxtPtr)0x0) && ((ctxt_00->lastError).code != 0)) {
              xmlCopyError(&ctxt_00->lastError,&oldctxt->lastError);
            }
            if (oldctxt != (xmlParserCtxtPtr)0x0) {
              ctxt_00->dict = (xmlDictPtr)0x0;
              ctxt_00->attsDefault = (xmlHashTablePtr)0x0;
              ctxt_00->attsSpecial = (xmlHashTablePtr)0x0;
              oldctxt->validate = ctxt_00->validate;
              oldctxt->valid = ctxt_00->valid;
              (oldctxt->node_seq).maximum = (ctxt_00->node_seq).maximum;
              (oldctxt->node_seq).length = (ctxt_00->node_seq).length;
              (oldctxt->node_seq).buffer = (ctxt_00->node_seq).buffer;
            }
            (ctxt_00->node_seq).maximum = 0;
            (ctxt_00->node_seq).length = 0;
            (ctxt_00->node_seq).buffer = (xmlParserNodeInfo *)0x0;
            xmlFreeParserCtxt(ctxt_00);
            doc_00->intSubset = (_xmlDtd *)0x0;
            doc_00->extSubset = (_xmlDtd *)0x0;
            xmlFreeDoc(doc_00);
            doc_local._4_4_ = enc;
          }
        }
      }
    }
  }
  else {
    doc_local._4_4_ = XML_ERR_ENTITY_LOOP;
  }
  return doc_local._4_4_;
}

Assistant:

static xmlParserErrors
xmlParseExternalEntityPrivate(xmlDocPtr doc, xmlParserCtxtPtr oldctxt,
	              xmlSAXHandlerPtr sax,
		      void *user_data, int depth, const xmlChar *URL,
		      const xmlChar *ID, xmlNodePtr *list) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr newDoc;
    xmlNodePtr newRoot;
    xmlParserErrors ret = XML_ERR_OK;
    xmlChar start[4];
    xmlCharEncoding enc;

    if (((depth > 40) &&
	((oldctxt == NULL) || (oldctxt->options & XML_PARSE_HUGE) == 0)) ||
	(depth > 1024)) {
	return(XML_ERR_ENTITY_LOOP);
    }

    if (list != NULL)
        *list = NULL;
    if ((URL == NULL) && (ID == NULL))
	return(XML_ERR_INTERNAL_ERROR);
    if (doc == NULL)
	return(XML_ERR_INTERNAL_ERROR);

    ctxt = xmlCreateEntityParserCtxtInternal(sax, user_data, URL, ID, NULL,
                                             oldctxt);
    if (ctxt == NULL) return(XML_WAR_UNDECLARED_ENTITY);
    xmlDetectSAX2(ctxt);

    newDoc = xmlNewDoc(BAD_CAST "1.0");
    if (newDoc == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(XML_ERR_INTERNAL_ERROR);
    }
    newDoc->properties = XML_DOC_INTERNAL;
    if (doc) {
        newDoc->intSubset = doc->intSubset;
        newDoc->extSubset = doc->extSubset;
        if (doc->dict) {
            newDoc->dict = doc->dict;
            xmlDictReference(newDoc->dict);
        }
        if (doc->URL != NULL) {
            newDoc->URL = xmlStrdup(doc->URL);
        }
    }
    newRoot = xmlNewDocNode(newDoc, NULL, BAD_CAST "pseudoroot", NULL);
    if (newRoot == NULL) {
	if (sax != NULL)
	xmlFreeParserCtxt(ctxt);
	newDoc->intSubset = NULL;
	newDoc->extSubset = NULL;
        xmlFreeDoc(newDoc);
	return(XML_ERR_INTERNAL_ERROR);
    }
    xmlAddChild((xmlNodePtr) newDoc, newRoot);
    nodePush(ctxt, newDoc->children);
    if (doc == NULL) {
        ctxt->myDoc = newDoc;
    } else {
        ctxt->myDoc = doc;
        newRoot->doc = doc;
    }

    /*
     * Get the 4 first bytes and decode the charset
     * if enc != XML_CHAR_ENCODING_NONE
     * plug some encoding conversion routines.
     */
    GROW;
    if ((ctxt->input->end - ctxt->input->cur) >= 4) {
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(start, 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }

    /*
     * Parse a possible text declaration first
     */
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	xmlParseTextDecl(ctxt);
        /*
         * An XML-1.0 document can't reference an entity not XML-1.0
         */
        if ((xmlStrEqual(oldctxt->version, BAD_CAST "1.0")) &&
            (!xmlStrEqual(ctxt->input->version, BAD_CAST "1.0"))) {
            xmlFatalErrMsg(ctxt, XML_ERR_VERSION_MISMATCH,
                           "Version mismatch between document and entity\n");
        }
    }

    ctxt->instate = XML_PARSER_CONTENT;
    ctxt->depth = depth;
    if (oldctxt != NULL) {
	ctxt->_private = oldctxt->_private;
	ctxt->loadsubset = oldctxt->loadsubset;
	ctxt->validate = oldctxt->validate;
	ctxt->valid = oldctxt->valid;
	ctxt->replaceEntities = oldctxt->replaceEntities;
        if (oldctxt->validate) {
            ctxt->vctxt.error = oldctxt->vctxt.error;
            ctxt->vctxt.warning = oldctxt->vctxt.warning;
            ctxt->vctxt.userData = oldctxt->vctxt.userData;
        }
	ctxt->external = oldctxt->external;
        if (ctxt->dict) xmlDictFree(ctxt->dict);
        ctxt->dict = oldctxt->dict;
        ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
        ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
        ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);
        ctxt->dictNames = oldctxt->dictNames;
        ctxt->attsDefault = oldctxt->attsDefault;
        ctxt->attsSpecial = oldctxt->attsSpecial;
        ctxt->linenumbers = oldctxt->linenumbers;
	ctxt->record_info = oldctxt->record_info;
	ctxt->node_seq.maximum = oldctxt->node_seq.maximum;
	ctxt->node_seq.length = oldctxt->node_seq.length;
	ctxt->node_seq.buffer = oldctxt->node_seq.buffer;
    } else {
	/*
	 * Doing validity checking on chunk without context
	 * doesn't make sense
	 */
	ctxt->_private = NULL;
	ctxt->validate = 0;
	ctxt->external = 2;
	ctxt->loadsubset = 0;
    }

    xmlParseContent(ctxt);

    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if (ctxt->node != newDoc->children) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
	if (list != NULL) {
	    xmlNodePtr cur;

	    /*
	     * Return the newly created nodeset after unlinking it from
	     * they pseudo parent.
	     */
	    cur = newDoc->children->children;
	    *list = cur;
	    while (cur != NULL) {
		cur->parent = NULL;
		cur = cur->next;
	    }
            newDoc->children->children = NULL;
	}
	ret = XML_ERR_OK;
    }

    /*
     * Record in the parent context the number of entities replacement
     * done when parsing that reference.
     */
    if (oldctxt != NULL)
        oldctxt->nbentities += ctxt->nbentities;

    /*
     * Also record the size of the entity parsed
     */
    if (ctxt->input != NULL && oldctxt != NULL) {
	oldctxt->sizeentities += ctxt->input->consumed;
	oldctxt->sizeentities += (ctxt->input->cur - ctxt->input->base);
    }
    /*
     * And record the last error if any
     */
    if ((oldctxt != NULL) && (ctxt->lastError.code != XML_ERR_OK))
        xmlCopyError(&ctxt->lastError, &oldctxt->lastError);

    if (oldctxt != NULL) {
        ctxt->dict = NULL;
        ctxt->attsDefault = NULL;
        ctxt->attsSpecial = NULL;
        oldctxt->validate = ctxt->validate;
        oldctxt->valid = ctxt->valid;
        oldctxt->node_seq.maximum = ctxt->node_seq.maximum;
        oldctxt->node_seq.length = ctxt->node_seq.length;
        oldctxt->node_seq.buffer = ctxt->node_seq.buffer;
    }
    ctxt->node_seq.maximum = 0;
    ctxt->node_seq.length = 0;
    ctxt->node_seq.buffer = NULL;
    xmlFreeParserCtxt(ctxt);
    newDoc->intSubset = NULL;
    newDoc->extSubset = NULL;
    xmlFreeDoc(newDoc);

    return(ret);
}